

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

bool boost::this_thread::interruption_requested(void)

{
  thread_data_base *ptVar1;
  undefined1 uVar2;
  lock_guard<boost::mutex> lg;
  lock_guard<boost::mutex> local_10;
  
  ptVar1 = detail::get_current_thread_data();
  if (ptVar1 == (thread_data_base *)0x0) {
    uVar2 = 0;
  }
  else {
    local_10.m = &ptVar1->data_mutex;
    mutex::lock(local_10.m);
    uVar2 = ptVar1->interrupt_requested;
    lock_guard<boost::mutex>::~lock_guard(&local_10);
  }
  return (bool)uVar2;
}

Assistant:

bool interruption_requested() BOOST_NOEXCEPT
        {
            boost::detail::thread_data_base* const thread_info=detail::get_current_thread_data();
            if(!thread_info)
            {
                return false;
            }
            else
            {
                lock_guard<mutex> lg(thread_info->data_mutex);
                return thread_info->interrupt_requested;
            }
        }